

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_insn_t_conflict
MIR_new_insn_arr(MIR_context_t ctx,MIR_insn_code_t code,size_t nops,MIR_op_t *ops)

{
  MIR_insn_t pMVar1;
  int iVar2;
  MIR_error_func_t p_Var3;
  MIR_insn_t pMVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  MIR_error_type_t MVar8;
  MIR_var_t local_b8;
  MIR_var_t local_a0;
  MIR_var_t local_88;
  MIR_var_t local_70;
  MIR_op_t *local_58;
  size_t expected_nops;
  size_t i;
  size_t narg;
  size_t args_start;
  MIR_proto_t proto;
  MIR_insn_t_conflict insn;
  MIR_op_t *ops_local;
  size_t nops_local;
  MIR_context_t pMStack_10;
  MIR_insn_code_t code_local;
  MIR_context_t ctx_local;
  
  expected_nops = 0;
  insn = (MIR_insn_t_conflict)ops;
  ops_local = (MIR_op_t *)nops;
  nops_local._4_4_ = code;
  pMStack_10 = ctx;
  local_58 = (MIR_op_t *)insn_code_nops(ctx,code);
  if ((ops_local != (MIR_op_t *)0x0) && (insn == (MIR_insn_t_conflict)0x0)) {
    __assert_fail("nops == 0 || ops != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x890,
                  "MIR_insn_t MIR_new_insn_arr(MIR_context_t, MIR_insn_code_t, size_t, MIR_op_t *)")
    ;
  }
  iVar2 = MIR_call_code_p(nops_local._4_4_);
  if (((((iVar2 == 0) && (nops_local._4_4_ != MIR_UNSPEC)) && (nops_local._4_4_ != MIR_USE)) &&
      ((nops_local._4_4_ != MIR_PHI && (nops_local._4_4_ != MIR_RET)))) &&
     ((nops_local._4_4_ != MIR_SWITCH && (ops_local != local_58)))) {
    p_Var3 = MIR_get_error_func(pMStack_10);
    (*p_Var3)(MIR_ops_num_error,"wrong number of operands for insn %s",
              insn_descs[nops_local._4_4_].name);
  }
  if (nops_local._4_4_ == MIR_SWITCH) {
    if (ops_local < (MIR_op_t *)0x2) {
      p_Var3 = MIR_get_error_func(pMStack_10);
      (*p_Var3)(MIR_ops_num_error,"number of MIR_SWITCH operands is less 2");
    }
  }
  else if (nops_local._4_4_ == MIR_PHI) {
    if (ops_local < (MIR_op_t *)0x3) {
      p_Var3 = MIR_get_error_func(pMStack_10);
      (*p_Var3)(MIR_ops_num_error,"number of MIR_PHI operands is less 3");
    }
  }
  else {
    iVar2 = MIR_call_code_p(nops_local._4_4_);
    if ((iVar2 == 0) && (nops_local._4_4_ != MIR_UNSPEC)) {
      if (nops_local._4_4_ == MIR_VA_ARG) {
        if ((*(ushort *)&insn[1].field_0x18 & 0xff) != 10) {
          p_Var3 = MIR_get_error_func(pMStack_10);
          (*p_Var3)(MIR_op_mode_error,"3rd operand of va_arg should be any memory with given type");
        }
      }
      else if (nops_local._4_4_ == MIR_PRSET) {
        if ((undefined1  [32])((undefined1  [32])insn->ops[0].u & (undefined1  [32])0xff) !=
            (undefined1  [32])0x3) {
          p_Var3 = MIR_get_error_func(pMStack_10);
          (*p_Var3)(MIR_op_mode_error,"property should be a integer operand");
        }
      }
      else if ((nops_local._4_4_ == MIR_PRBEQ) || (nops_local._4_4_ == MIR_PRBNE)) {
        if ((*(ushort *)&insn[1].field_0x18 & 0xff) != 3) {
          p_Var3 = MIR_get_error_func(pMStack_10);
          (*p_Var3)(MIR_op_mode_error,"property should be a integer operand");
        }
        if (((undefined1  [32])((undefined1  [32])insn->ops[0].u & (undefined1  [32])0xff) !=
             (undefined1  [32])0x1) &&
           ((undefined1  [32])((undefined1  [32])insn->ops[0].u & (undefined1  [32])0xff) !=
            (undefined1  [32])0xa)) {
          p_Var3 = MIR_get_error_func(pMStack_10);
          (*p_Var3)(MIR_op_mode_error,
                    "2nd operand of property branch should be any memory or reg with given type");
        }
      }
    }
    else {
      iVar2 = 2;
      if (nops_local._4_4_ == MIR_UNSPEC) {
        iVar2 = 1;
      }
      narg = (size_t)iVar2;
      if (ops_local < narg) {
        p_Var3 = MIR_get_error_func(pMStack_10);
        (*p_Var3)(MIR_ops_num_error,"wrong number of call/unspec operands");
      }
      if (nops_local._4_4_ == MIR_UNSPEC) {
        if ((((ulong)(insn->insn_link).prev & 0xff) != 3) ||
           (pMVar1 = (insn->insn_link).next,
           pMVar4 = (MIR_insn_t)VARR_MIR_proto_tlength(pMStack_10->unspec_protos), pMVar4 <= pMVar1)
           ) {
          p_Var3 = MIR_get_error_func(pMStack_10);
          (*p_Var3)(MIR_unspec_op_error,"the 1st unspec operand should be valid unspec code");
        }
        args_start = (size_t)VARR_MIR_proto_tget(pMStack_10->unspec_protos,
                                                 (size_t)(insn->insn_link).next);
      }
      else {
        if ((((ulong)(insn->insn_link).prev & 0xff) != 8) ||
           (*(int *)&((insn->insn_link).next)->ops[0].data != 1)) {
          p_Var3 = MIR_get_error_func(pMStack_10);
          (*p_Var3)(MIR_call_op_error,"the 1st call operand should be a prototype");
        }
        args_start = *(size_t *)((long)&((insn->insn_link).next)->ops[0].u + 0x10);
      }
      expected_nops = (size_t)*(uint *)(args_start + 8);
      if (*(long *)(args_start + 0x20) != 0) {
        sVar5 = VARR_MIR_var_tlength(*(VARR_MIR_var_t **)(args_start + 0x20));
        expected_nops = sVar5 + expected_nops;
      }
      if ((ops_local < (MIR_op_t *)(expected_nops + narg)) ||
         ((ops_local != (MIR_op_t *)(expected_nops + narg) && (*(char *)(args_start + 0x18) == '\0')
          ))) {
        p_Var3 = MIR_get_error_func(pMStack_10);
        MVar8 = MIR_call_op_error;
        if (nops_local._4_4_ == MIR_UNSPEC) {
          MVar8 = MIR_unspec_op_error;
        }
        pcVar7 = "call";
        if (nops_local._4_4_ == MIR_UNSPEC) {
          pcVar7 = "unspec";
        }
        (*p_Var3)(MVar8,"number of %s operands or results does not correspond to prototype %s",
                  pcVar7,*(undefined8 *)args_start);
      }
      for (expected_nops = narg; expected_nops < ops_local; expected_nops = expected_nops + 1) {
        if (((undefined1  [32])
             ((undefined1  [32])insn->ops[expected_nops - 1].u & (undefined1  [32])0xff) ==
             (undefined1  [32])0xa) &&
           (iVar2 = MIR_all_blk_type_p((uint)*(byte *)((long)&insn->ops[expected_nops - 1].u + 0x10)
                                      ), iVar2 != 0)) {
          if (expected_nops - narg < (ulong)*(uint *)(args_start + 8)) {
            p_Var3 = MIR_get_error_func(pMStack_10);
            pcVar7 = "call";
            if (nops_local._4_4_ == MIR_UNSPEC) {
              pcVar7 = "unspec";
            }
            (*p_Var3)(MIR_wrong_type_error,"result of %s is block type memory",pcVar7);
          }
          uVar6 = (expected_nops - narg) - (ulong)*(uint *)(args_start + 8);
          i = uVar6;
          sVar5 = VARR_MIR_var_tlength(*(VARR_MIR_var_t **)(args_start + 0x20));
          if (uVar6 < sVar5) {
            VARR_MIR_var_tget(&local_70,*(VARR_MIR_var_t **)(args_start + 0x20),i);
            if (local_70.type != *(byte *)((long)&insn->ops[expected_nops - 1].u + 0x10)) {
              p_Var3 = MIR_get_error_func(pMStack_10);
              pcVar7 = "call";
              if (nops_local._4_4_ == MIR_UNSPEC) {
                pcVar7 = "unspec";
              }
              (*p_Var3)(MIR_wrong_type_error,
                        "arg of %s is block type memory but param is not of block type",pcVar7);
            }
            VARR_MIR_var_tget(&local_88,*(VARR_MIR_var_t **)(args_start + 0x20),i);
            if (local_88.size != *(size_t *)&insn->ops[expected_nops].field_0x8) {
              p_Var3 = MIR_get_error_func(pMStack_10);
              VARR_MIR_var_tget(&local_a0,*(VARR_MIR_var_t **)(args_start + 0x20),i);
              pcVar7 = "call";
              if (nops_local._4_4_ == MIR_UNSPEC) {
                pcVar7 = "unspec";
              }
              (*p_Var3)(MIR_wrong_type_error,
                        "different sizes (%lu vs %lu) of arg and param block memory in %s insn",
                        local_a0.size,*(undefined8 *)&insn->ops[expected_nops].field_0x8,pcVar7);
            }
          }
          else if (*(char *)((long)&insn->ops[expected_nops - 1].u + 0x10) == '\x11') {
            p_Var3 = MIR_get_error_func(pMStack_10);
            pcVar7 = "call";
            if (nops_local._4_4_ == MIR_UNSPEC) {
              pcVar7 = "unspec";
            }
            (*p_Var3)(MIR_wrong_type_error,
                      "RBLK memory can not correspond to unnamed param in %s insn",pcVar7);
          }
        }
        else if ((ulong)*(uint *)(args_start + 8) <= expected_nops - narg) {
          uVar6 = (expected_nops - narg) - (ulong)*(uint *)(args_start + 8);
          i = uVar6;
          sVar5 = VARR_MIR_var_tlength(*(VARR_MIR_var_t **)(args_start + 0x20));
          if (uVar6 < sVar5) {
            VARR_MIR_var_tget(&local_b8,*(VARR_MIR_var_t **)(args_start + 0x20),i);
            iVar2 = MIR_all_blk_type_p(local_b8.type);
            if (iVar2 != 0) {
              p_Var3 = MIR_get_error_func(pMStack_10);
              pcVar7 = "call";
              if (nops_local._4_4_ == MIR_UNSPEC) {
                pcVar7 = "unspec";
              }
              (*p_Var3)(MIR_wrong_type_error,
                        "param of %s is of block type but arg is not of block type memory",pcVar7);
            }
          }
        }
      }
    }
  }
  proto = (MIR_proto_t)create_insn(pMStack_10,(size_t)ops_local,nops_local._4_4_);
  *(ulong *)&((MIR_insn_t_conflict)proto)->field_0x18 =
       *(ulong *)&((MIR_insn_t_conflict)proto)->field_0x18 & 0xffffffff | (long)ops_local << 0x20;
  for (expected_nops = 0; expected_nops < ops_local; expected_nops = expected_nops + 1) {
    memcpy((void *)((long)proto + expected_nops * 0x30 + 0x20),&insn->ops[expected_nops - 1].u,0x30)
    ;
  }
  return (MIR_insn_t_conflict)proto;
}

Assistant:

MIR_insn_t MIR_new_insn_arr (MIR_context_t ctx, MIR_insn_code_t code, size_t nops, MIR_op_t *ops) {
  MIR_insn_t insn;
  MIR_proto_t proto;
  size_t args_start, narg, i = 0, expected_nops = insn_code_nops (ctx, code);
  mir_assert (nops == 0 || ops != NULL);

  if (!MIR_call_code_p (code) && code != MIR_UNSPEC && code != MIR_USE && code != MIR_PHI
      && code != MIR_RET && code != MIR_SWITCH && nops != expected_nops) {
    MIR_get_error_func (ctx) (MIR_ops_num_error, "wrong number of operands for insn %s",
                              insn_descs[code].name);
  } else if (code == MIR_SWITCH) {
    if (nops < 2)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "number of MIR_SWITCH operands is less 2");
  } else if (code == MIR_PHI) {
    if (nops < 3)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "number of MIR_PHI operands is less 3");
  } else if (MIR_call_code_p (code) || code == MIR_UNSPEC) {
    args_start = code == MIR_UNSPEC ? 1 : 2;
    if (nops < args_start)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "wrong number of call/unspec operands");
    if (code == MIR_UNSPEC) {
      if (ops[0].mode != MIR_OP_INT || ops[0].u.u >= VARR_LENGTH (MIR_proto_t, unspec_protos))
        MIR_get_error_func (ctx) (MIR_unspec_op_error,
                                  "the 1st unspec operand should be valid unspec code");
      proto = VARR_GET (MIR_proto_t, unspec_protos, ops[0].u.u);
    } else {
      if (ops[0].mode != MIR_OP_REF || ops[0].u.ref->item_type != MIR_proto_item)
        MIR_get_error_func (ctx) (MIR_call_op_error, "the 1st call operand should be a prototype");
      proto = ops[0].u.ref->u.proto;
    }
    i = proto->nres;
    if (proto->args != NULL) i += VARR_LENGTH (MIR_var_t, proto->args);
    if (nops < i + args_start || (nops != i + args_start && !proto->vararg_p))
      MIR_get_error_func (
        ctx) (code == MIR_UNSPEC ? MIR_unspec_op_error : MIR_call_op_error,
              "number of %s operands or results does not correspond to prototype %s",
              code == MIR_UNSPEC ? "unspec" : "call", proto->name);
    for (i = args_start; i < nops; i++) {
      if (ops[i].mode == MIR_OP_MEM && MIR_all_blk_type_p (ops[i].u.mem.type)) {
        if (i - args_start < proto->nres)
          MIR_get_error_func (ctx) (MIR_wrong_type_error, "result of %s is block type memory",
                                    code == MIR_UNSPEC ? "unspec" : "call");
        else if ((narg = i - args_start - proto->nres) < VARR_LENGTH (MIR_var_t, proto->args)) {
          if (VARR_GET (MIR_var_t, proto->args, narg).type != ops[i].u.mem.type) {
            MIR_get_error_func (
              ctx) (MIR_wrong_type_error,
                    "arg of %s is block type memory but param is not of block type",
                    code == MIR_UNSPEC ? "unspec" : "call");
          } else if (VARR_GET (MIR_var_t, proto->args, narg).size != (size_t) ops[i].u.mem.disp) {
            MIR_get_error_func (
              ctx) (MIR_wrong_type_error,
                    "different sizes (%lu vs %lu) of arg and param block memory in %s insn",
                    (unsigned long) VARR_GET (MIR_var_t, proto->args, narg).size,
                    (unsigned long) ops[i].u.mem.disp, code == MIR_UNSPEC ? "unspec" : "call");
          }
        } else if (ops[i].u.mem.type == MIR_T_RBLK) {
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "RBLK memory can not correspond to unnamed param in %s insn",
                                    code == MIR_UNSPEC ? "unspec" : "call");
        }
      } else if (i - args_start >= proto->nres
                 && (narg = i - args_start - proto->nres) < VARR_LENGTH (MIR_var_t, proto->args)
                 && MIR_all_blk_type_p (VARR_GET (MIR_var_t, proto->args, narg).type)) {
        MIR_get_error_func (
          ctx) (MIR_wrong_type_error,
                "param of %s is of block type but arg is not of block type memory",
                code == MIR_UNSPEC ? "unspec" : "call");
      }
    }
  } else if (code == MIR_VA_ARG) {  // undef mem ???
    if (ops[2].mode != MIR_OP_MEM)
      MIR_get_error_func (ctx) (MIR_op_mode_error,
                                "3rd operand of va_arg should be any memory with given type");
  } else if (code == MIR_PRSET) {
    if (ops[1].mode != MIR_OP_INT)
      MIR_get_error_func (ctx) (MIR_op_mode_error, "property should be a integer operand");
  } else if (code == MIR_PRBEQ || code == MIR_PRBNE) {
    if (ops[2].mode != MIR_OP_INT)
      MIR_get_error_func (ctx) (MIR_op_mode_error, "property should be a integer operand");
    if (ops[1].mode != MIR_OP_REG && ops[1].mode != MIR_OP_MEM)
      MIR_get_error_func (
        ctx) (MIR_op_mode_error,
              "2nd operand of property branch should be any memory or reg with given type");
  }
  insn = create_insn (ctx, nops, code);
  insn->nops = (unsigned int) nops;
  for (i = 0; i < nops; i++) insn->ops[i] = ops[i];
  return insn;
}